

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O2

Fl_Double_Window * make_sourceview(void)

{
  CodeViewer *pCVar1;
  Fl_Double_Window *pFVar2;
  Fl_Tabs *this;
  Fl_Group *pFVar3;
  Fl_Text_Display *pFVar4;
  Fl_Group *pFVar5;
  Fl_Button *pFVar6;
  Fl_Light_Button *pFVar7;
  Fl_Widget *this_00;
  
  pFVar2 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar2,0x208,0x1ea,"Code View");
  sourceview_panel = pFVar2;
  (pFVar2->super_Fl_Window).super_Fl_Group.super_Fl_Widget.callback_ = toggle_sourceview_cb;
  (pFVar2->super_Fl_Window).super_Fl_Group.super_Fl_Widget.label_.align_ = 0x50;
  this = (Fl_Tabs *)operator_new(200);
  Fl_Tabs::Fl_Tabs(this,10,10,500,0x1b8,(char *)0x0);
  sv_tab = this;
  (this->super_Fl_Group).super_Fl_Widget.color2_ = 4;
  (this->super_Fl_Group).super_Fl_Widget.label_.color = 7;
  (this->super_Fl_Group).super_Fl_Widget.callback_ = update_sourceview_position_cb;
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x23,500,0x19f,"Source");
  (pFVar3->super_Fl_Widget).label_.size = 0xd;
  pFVar4 = (Fl_Text_Display *)operator_new(0x1c0);
  CodeViewer::CodeViewer((CodeViewer *)pFVar4,0x14,0x32,0x1e0,0x186,(char *)0x0);
  sv_source = (CodeViewer *)pFVar4;
  (pFVar4->super_Fl_Group).super_Fl_Widget.box_ = '\x05';
  (pFVar4->super_Fl_Group).super_Fl_Widget.color_ = 7;
  (pFVar4->super_Fl_Group).super_Fl_Widget.color2_ = 0xf;
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.type = '\0';
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.font = 0;
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.size = 0xe;
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.color = 0;
  pFVar4->textfont_ = 4;
  pFVar4->mColumnScale = 0.0;
  CodeEditor::textsize((CodeEditor *)pFVar4,0xb);
  pCVar1 = sv_source;
  (sv_source->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.super_Fl_Group.
  super_Fl_Widget.label_.align_ = 1;
  (pCVar1->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.super_Fl_Group.
  super_Fl_Widget.when_ = '\x04';
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = (Fl_Widget *)sv_source;
  Fl_Text_Display::linenumber_width(pFVar4,0x3c);
  Fl_Text_Display::linenumber_size(pFVar4,pFVar4->textsize_);
  Fl_Group::end(pFVar3);
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = (Fl_Widget *)pFVar3;
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x23,500,0x19f,"Header");
  (pFVar3->super_Fl_Widget).label_.size = 0xd;
  (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[6])(pFVar3);
  pFVar4 = (Fl_Text_Display *)operator_new(0x1c0);
  CodeViewer::CodeViewer((CodeViewer *)pFVar4,0x14,0x32,0x1e0,0x186,(char *)0x0);
  sv_header = (CodeViewer *)pFVar4;
  (pFVar4->super_Fl_Group).super_Fl_Widget.box_ = '\x05';
  (pFVar4->super_Fl_Group).super_Fl_Widget.color_ = 7;
  (pFVar4->super_Fl_Group).super_Fl_Widget.color2_ = 0xf;
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.type = '\0';
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.font = 0;
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.size = 0xe;
  (pFVar4->super_Fl_Group).super_Fl_Widget.label_.color = 0;
  pFVar4->textfont_ = 4;
  pFVar4->mColumnScale = 0.0;
  CodeEditor::textsize((CodeEditor *)pFVar4,0xb);
  pCVar1 = sv_header;
  (sv_header->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.super_Fl_Group.
  super_Fl_Widget.label_.align_ = 1;
  (pCVar1->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.super_Fl_Group.
  super_Fl_Widget.when_ = '\x04';
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = (Fl_Widget *)sv_header;
  Fl_Text_Display::linenumber_width(pFVar4,0x3c);
  Fl_Text_Display::linenumber_size(pFVar4,pFVar4->textsize_);
  Fl_Group::end(pFVar3);
  Fl_Group::end(&sv_tab->super_Fl_Group);
  pFVar3 = Fl_Group::current();
  pFVar3->resizable_ = (Fl_Widget *)sv_tab;
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x1cc,500,0x14,(char *)0x0);
  pFVar6 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar6,10,0x1cc,0x3d,0x14,"Refresh");
  (pFVar6->super_Fl_Widget).label_.size = 0xb;
  (pFVar6->super_Fl_Widget).callback_ = update_sourceview_cb;
  pFVar7 = (Fl_Light_Button *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button(pFVar7,0x4c,0x1cc,0x5b,0x14,"Auto-Refresh");
  sv_autorefresh = pFVar7;
  (pFVar7->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  (pFVar7->super_Fl_Button).super_Fl_Widget.callback_ = update_sourceview_cb;
  pFVar7 = (Fl_Light_Button *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button(pFVar7,0xac,0x1cc,0x59,0x14,"Auto-Position");
  sv_autoposition = pFVar7;
  (pFVar7->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  pFVar6 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar6,0x1cc,0x1cc,0x32,0x14,"Close");
  (pFVar6->super_Fl_Widget).label_.size = 0xb;
  (pFVar6->super_Fl_Widget).callback_ = toggle_sourceview_b_cb;
  this_00 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)this_00,0x109,0x1cc,0xbe,0x14,(char *)0x0);
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = this_00;
  Fl_Group::end(pFVar3);
  pFVar2 = sourceview_panel;
  (pFVar2->super_Fl_Window).minw = 0x180;
  (pFVar2->super_Fl_Window).minh = 0x78;
  (pFVar2->super_Fl_Window).maxw = 0;
  (pFVar2->super_Fl_Window).maxh = 0;
  (pFVar2->super_Fl_Window).dw = 0;
  (pFVar2->super_Fl_Window).dh = 0;
  (pFVar2->super_Fl_Window).aspect = 0;
  Fl_Window::size_range_(&pFVar2->super_Fl_Window);
  Fl_Group::end((Fl_Group *)sourceview_panel);
  return sourceview_panel;
}

Assistant:

Fl_Double_Window* make_sourceview() {
  { sourceview_panel = new Fl_Double_Window(520, 490, "Code View");
    sourceview_panel->callback((Fl_Callback*)toggle_sourceview_cb);
    sourceview_panel->align(Fl_Align(FL_ALIGN_CLIP|FL_ALIGN_INSIDE));
    { sv_tab = new Fl_Tabs(10, 10, 500, 440);
      sv_tab->selection_color((Fl_Color)4);
      sv_tab->labelcolor(FL_BACKGROUND2_COLOR);
      sv_tab->callback((Fl_Callback*)update_sourceview_position_cb);
      { Fl_Group* o = new Fl_Group(10, 35, 500, 415, "Source");
        o->labelsize(13);
        { CodeViewer* o = sv_source = new CodeViewer(20, 50, 480, 390);
          sv_source->box(FL_DOWN_FRAME);
          sv_source->color(FL_BACKGROUND2_COLOR);
          sv_source->selection_color(FL_SELECTION_COLOR);
          sv_source->labeltype(FL_NORMAL_LABEL);
          sv_source->labelfont(0);
          sv_source->labelsize(14);
          sv_source->labelcolor(FL_FOREGROUND_COLOR);
          sv_source->textfont(4);
          sv_source->textsize(11);
          sv_source->align(Fl_Align(FL_ALIGN_TOP));
          sv_source->when(FL_WHEN_RELEASE);
          Fl_Group::current()->resizable(sv_source);
          o->linenumber_width(60);
          o->linenumber_size(o->Fl_Text_Display::textsize());
        } // CodeViewer* sv_source
        o->end();
        Fl_Group::current()->resizable(o);
      } // Fl_Group* o
      { Fl_Group* o = new Fl_Group(10, 35, 500, 415, "Header");
        o->labelsize(13);
        o->hide();
        { CodeViewer* o = sv_header = new CodeViewer(20, 50, 480, 390);
          sv_header->box(FL_DOWN_FRAME);
          sv_header->color(FL_BACKGROUND2_COLOR);
          sv_header->selection_color(FL_SELECTION_COLOR);
          sv_header->labeltype(FL_NORMAL_LABEL);
          sv_header->labelfont(0);
          sv_header->labelsize(14);
          sv_header->labelcolor(FL_FOREGROUND_COLOR);
          sv_header->textfont(4);
          sv_header->textsize(11);
          sv_header->align(Fl_Align(FL_ALIGN_TOP));
          sv_header->when(FL_WHEN_RELEASE);
          Fl_Group::current()->resizable(sv_header);
          o->linenumber_width(60);
          o->linenumber_size(o->Fl_Text_Display::textsize());
        } // CodeViewer* sv_header
        o->end();
      } // Fl_Group* o
      sv_tab->end();
      Fl_Group::current()->resizable(sv_tab);
    } // Fl_Tabs* sv_tab
    { Fl_Group* o = new Fl_Group(10, 460, 500, 20);
      { Fl_Button* o = new Fl_Button(10, 460, 61, 20, "Refresh");
        o->labelsize(11);
        o->callback((Fl_Callback*)update_sourceview_cb);
      } // Fl_Button* o
      { Fl_Light_Button* o = sv_autorefresh = new Fl_Light_Button(76, 460, 91, 20, "Auto-Refresh");
        sv_autorefresh->labelsize(11);
        o->callback((Fl_Callback*)update_sourceview_cb);
      } // Fl_Light_Button* sv_autorefresh
      { sv_autoposition = new Fl_Light_Button(172, 460, 89, 20, "Auto-Position");
        sv_autoposition->labelsize(11);
      } // Fl_Light_Button* sv_autoposition
      { Fl_Button* o = new Fl_Button(460, 460, 50, 20, "Close");
        o->labelsize(11);
        o->callback((Fl_Callback*)toggle_sourceview_b_cb);
      } // Fl_Button* o
      { Fl_Box* o = new Fl_Box(265, 460, 190, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    sourceview_panel->size_range(384, 120);
    sourceview_panel->end();
  } // Fl_Double_Window* sourceview_panel
  return sourceview_panel;
}